

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O1

QAccessibleInterface * __thiscall QAccessibleMenu::parent(QAccessibleMenu *this)

{
  QPodArrayOps<QObject*> *pQVar1;
  QPodArrayOps<QObject*> *pQVar2;
  QWidget *this_00;
  QMenu *this_01;
  QAction *action;
  long lVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  QPodArrayOps<QObject*> *pQVar6;
  QWidget *widget;
  QAccessibleInterface *unaff_R14;
  QPodArrayOps<QObject*> *this_02;
  long in_FS_OFFSET;
  bool bVar7;
  bool bVar8;
  QAccessibleInterface *local_a0;
  QList<QAction_*> local_90;
  QArrayData *local_78;
  QObject **ppQStack_70;
  undefined1 *local_68;
  QArrayData *local_58;
  undefined8 *puStack_50;
  qsizetype local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))();
  this_01 = (QMenu *)QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
  action = QMenu::menuAction(this_01);
  if (action == (QAction *)0x0) {
    bVar7 = true;
    local_a0 = unaff_R14;
  }
  else {
    this_02 = (QPodArrayOps<QObject*> *)&local_58;
    local_58 = (QArrayData *)0x0;
    puStack_50 = (undefined8 *)0x0;
    local_48 = 0;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    ppQStack_70 = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
    QAction::associatedObjects();
    QList<QObject_*>::reserve((QList<QObject_*> *)this_02,(qsizetype)(local_68 + 1));
    (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    lVar3 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
    local_90.d.d = *(Data **)(*(long *)(lVar3 + 8) + 0x10);
    QtPrivate::QPodArrayOps<QObject*>::emplace<QObject*&>(this_02,local_48,(QObject **)&local_90);
    QList<QObject_*>::end((QList<QObject_*> *)this_02);
    QtPrivate::QCommonArrayOps<QObject_*>::growAppend
              ((QCommonArrayOps<QObject_*> *)this_02,ppQStack_70,ppQStack_70 + (long)local_68);
    bVar7 = local_48 == 0;
    if (!bVar7) {
      puVar4 = puStack_50 + local_48;
      puVar5 = puStack_50;
      do {
        this_00 = (QWidget *)*puVar5;
        lVar3 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
        if ((lVar3 == 0) &&
           (lVar3 = QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject), lVar3 == 0)) {
          bVar8 = true;
        }
        else {
          QWidget::actions(&local_90,this_00);
          if (local_90.d.size == 0) {
LAB_00522bff:
            this_02 = (QPodArrayOps<QObject*> *)0xffffffffffffffff;
          }
          else {
            pQVar6 = (QPodArrayOps<QObject*> *)0xfffffffffffffff8;
            do {
              pQVar1 = pQVar6 + local_90.d.size * -8;
              if (pQVar1 == (QPodArrayOps<QObject*> *)0xfffffffffffffff8) goto LAB_00522bf9;
              this_02 = pQVar6 + 8;
              pQVar2 = (QPodArrayOps<QObject*> *)((long)(local_90.d.ptr + 1) + (long)pQVar6);
              pQVar6 = this_02;
            } while (*(QAction **)pQVar2 != action);
            this_02 = (QPodArrayOps<QObject*> *)((long)this_02 >> 3);
LAB_00522bf9:
            if (pQVar1 == (QPodArrayOps<QObject*> *)0xfffffffffffffff8) goto LAB_00522bff;
          }
          bVar8 = this_02 == (QPodArrayOps<QObject*> *)0xffffffffffffffff;
          if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,8,0x10);
            }
          }
          if (this_02 != (QPodArrayOps<QObject*> *)0xffffffffffffffff) {
            local_a0 = getOrCreateMenu(this_00,action);
          }
        }
        if (!bVar8) break;
        puVar5 = puVar5 + 1;
        bVar7 = puVar5 == puVar4;
      } while (!bVar7);
    }
    if (local_78 != (QArrayData *)0x0) {
      LOCK();
      (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_78,8,0x10);
      }
    }
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,8,0x10);
      }
    }
  }
  if (bVar7) {
    local_a0 = QAccessibleWidget::parent(&this->super_QAccessibleWidget);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_a0;
}

Assistant:

QAccessibleInterface *QAccessibleMenu::parent() const
{
    if (QAction *menuAction = menu()->menuAction()) {
        QList<QObject *> parentCandidates;
        const QList<QObject *> associatedObjects = menuAction->associatedObjects();
        parentCandidates.reserve(associatedObjects.size() + 1);
        parentCandidates << menu()->parentWidget() << associatedObjects;
        for (QObject *object : std::as_const(parentCandidates)) {
            if (qobject_cast<QMenu*>(object)
#if QT_CONFIG(menubar)
                || qobject_cast<QMenuBar*>(object)
#endif
                ) {
                QWidget *widget = static_cast<QWidget*>(object);
                if (widget->actions().indexOf(menuAction) != -1)
                    return getOrCreateMenu(widget, menuAction);
            }
        }
    }
    return QAccessibleWidget::parent();
}